

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_blob_open(sqlite3 *db,char *zDb,char *zTable,char *zColumn,sqlite_int64 iRow,int wrFlag,
                     sqlite3_blob **ppBlob)

{
  short sVar1;
  Db *pDVar2;
  Index *pIVar3;
  Schema *pSchema;
  FKey *pFVar4;
  uint p2;
  int iVar5;
  int err_code;
  Incrblob *p;
  Table *pTVar6;
  Index **ppIVar7;
  Vdbe *p_00;
  FKey **ppFVar8;
  Op *pOVar9;
  long lVar10;
  char *pcVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  char *local_210;
  int local_204;
  uint local_200;
  int local_1fc;
  VdbeOp *local_1f8;
  char *local_1f0;
  Incrblob *local_1e8;
  char *local_1e0;
  sqlite_int64 local_1d8;
  char *local_1d0;
  Parse sParse;
  
  local_210 = (char *)0x0;
  *ppBlob = (sqlite3_blob *)0x0;
  local_204 = wrFlag;
  local_1f0 = zTable;
  local_1e0 = zColumn;
  local_1d8 = iRow;
  local_1d0 = zDb;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  p2 = (uint)(wrFlag != 0);
  p = (Incrblob *)sqlite3DbMallocZero(db,0x38);
  iVar5 = 0;
  local_200 = 0;
  local_1e8 = p;
  do {
    memset(&sParse,0,0x198);
    if (p == (Incrblob *)0x0) goto LAB_00124722;
    sParse.db = db;
    sqlite3DbFree(db,local_210);
    local_210 = (char *)0x0;
    sqlite3BtreeEnterAll(db);
    pTVar6 = sqlite3LocateTable(&sParse,0,local_1f0,local_1d0);
    if (pTVar6 == (Table *)0x0) {
LAB_0012476d:
      if (sParse.zErrMsg != (char *)0x0) {
        sqlite3DbFree(db,(void *)0x0);
        local_210 = sParse.zErrMsg;
        sParse.zErrMsg = (char *)0x0;
      }
      sqlite3BtreeLeaveAll(db);
      err_code = 1;
      goto LAB_001247f9;
    }
    if (pTVar6->nModuleArg != 0) {
      pcVar15 = "cannot open virtual table: %s";
LAB_0012475c:
      sqlite3ErrorMsg(&sParse,pcVar15,local_1f0);
      goto LAB_0012476d;
    }
    if ((pTVar6->tabFlags & 0x20) != 0) {
      pcVar15 = "cannot open table without rowid: %s";
      goto LAB_0012475c;
    }
    if (pTVar6->pSelect != (Select *)0x0) {
      pcVar15 = "cannot open view: %s";
      goto LAB_0012475c;
    }
    p->pTab = pTVar6;
    pDVar2 = db->aDb;
    local_1fc = iVar5;
    iVar5 = sqlite3SchemaToIndex(db,pTVar6->pSchema);
    p->zDb = pDVar2[iVar5].zDbSName;
    sVar1 = pTVar6->nCol;
    uVar13 = 0;
    if (0 < sVar1) {
      uVar13 = (ulong)(uint)(int)sVar1;
    }
    lVar10 = 0;
    for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
      iVar5 = sqlite3StrICmp(*(char **)((long)&pTVar6->aCol->zName + lVar10),local_1e0);
      if (iVar5 == 0) {
        uVar13 = uVar14 & 0xffffffff;
        break;
      }
      lVar10 = lVar10 + 0x20;
    }
    p = local_1e8;
    uVar12 = (uint)uVar13;
    if (uVar12 == (int)sVar1) {
      sqlite3DbFree(db,(void *)0x0);
      pcVar11 = "no such column: \"%s\"";
      pcVar15 = local_1e0;
LAB_001247dc:
      local_210 = sqlite3MPrintf(db,pcVar11,pcVar15);
      sqlite3BtreeLeaveAll(db);
      err_code = 1;
      goto LAB_001247f4;
    }
    if (local_204 != 0) {
      if ((db->flags & 0x4000) == 0) {
        pcVar15 = (char *)0x0;
      }
      else {
        pcVar15 = (char *)0x0;
        ppFVar8 = &pTVar6->pFKey;
        while (pFVar4 = *ppFVar8, pFVar4 != (FKey *)0x0) {
          uVar14 = (ulong)(uint)pFVar4->nCol;
          if (pFVar4->nCol < 1) {
            uVar14 = 0;
          }
          for (lVar10 = 0; uVar14 * 0x10 != lVar10; lVar10 = lVar10 + 0x10) {
            if (*(uint *)((long)&pFVar4->aCol[0].iFrom + lVar10) == uVar12) {
              pcVar15 = "foreign key";
            }
          }
          ppFVar8 = &pFVar4->pNextFrom;
        }
      }
      ppIVar7 = &pTVar6->pIndex;
      while (pIVar3 = *ppIVar7, pIVar3 != (Index *)0x0) {
        for (uVar14 = 0; pIVar3->nKeyCol != uVar14; uVar14 = uVar14 + 1) {
          if (uVar12 == (int)pIVar3->aiColumn[uVar14]) {
            pcVar15 = "indexed";
          }
          if ((int)pIVar3->aiColumn[uVar14] == 0xfffffffe) {
            pcVar15 = "indexed";
          }
        }
        ppIVar7 = &pIVar3->pNext;
      }
      if (pcVar15 != (char *)0x0) {
        sqlite3DbFree(db,(void *)0x0);
        pcVar11 = "cannot open %s column for writing";
        goto LAB_001247dc;
      }
    }
    p_00 = sqlite3VdbeCreate(&sParse);
    p->pStmt = (sqlite3_stmt *)p_00;
    if (p_00 != (Vdbe *)0x0) {
      pSchema = pTVar6->pSchema;
      iVar5 = sqlite3SchemaToIndex(db,pSchema);
      pOVar9 = (Op *)(ulong)p2;
      sqlite3VdbeAddOp4Int(p_00,2,iVar5,p2,pSchema->schema_cookie,pSchema->iGeneration);
      if (0 < (long)p_00->nOp) {
        pOVar9 = p_00->aOp;
        pOVar9[(long)p_00->nOp + -1].p5 = 1;
      }
      local_1f8 = sqlite3VdbeAddOpList(p_00,6,sqlite3_blob_open::openBlob,(int)pOVar9);
      sqlite3VdbeUsesBtree(p_00,iVar5);
      if (db->mallocFailed == '\0') {
        local_1f8->p1 = iVar5;
        local_1f8->p2 = pTVar6->tnum;
        local_1f8->p3 = p2;
        sqlite3VdbeChangeP4(p_00,2,pTVar6->zName,0);
        if (db->mallocFailed == '\0') {
          if (local_204 != 0) {
            local_1f8[1].opcode = 'n';
          }
          local_1f8[1].p2 = pTVar6->tnum;
          local_1f8[1].p3 = iVar5;
          local_1f8[1].p4type = -3;
          local_1f8[1].p4.i = pTVar6->nCol + 1;
          local_1f8[3].p2 = (int)pTVar6->nCol;
          sParse.nVar = 0;
          sParse.nTab = 1;
          sParse.nMem = 1;
          sqlite3VdbeMakeReady(p_00,&sParse);
        }
      }
    }
    p = local_1e8;
    local_1e8->iCol = (u16)uVar13;
    local_1e8->db = db;
    sqlite3BtreeLeaveAll(db);
    err_code = local_1fc;
    if ((db->mallocFailed != '\0') ||
       (err_code = blobSeekToRow(p,local_1d8,&local_210), 0x30 < local_200)) break;
    local_200 = local_200 + 1;
    iVar5 = 0x11;
  } while (err_code == 0x11);
  if (err_code == 0) {
LAB_00124722:
    err_code = 0;
    if (db->mallocFailed == '\0') {
      *ppBlob = (sqlite3_blob *)p;
      err_code = 0;
      goto LAB_00124812;
    }
LAB_001247f4:
    if (p != (Incrblob *)0x0) goto LAB_001247f9;
  }
  else {
LAB_001247f9:
    if ((Vdbe *)p->pStmt != (Vdbe *)0x0) {
      sqlite3VdbeFinalize((Vdbe *)p->pStmt);
    }
  }
  sqlite3DbFree(db,p);
LAB_00124812:
  pcVar11 = local_210;
  pcVar15 = "%s";
  if (local_210 == (char *)0x0) {
    pcVar15 = (char *)0x0;
  }
  sqlite3ErrorWithMsg(db,err_code,pcVar15,local_210);
  sqlite3DbFree(db,pcVar11);
  sqlite3ParserReset(&sParse);
  iVar5 = sqlite3ApiExit(db,err_code);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar5;
}

Assistant:

SQLITE_API int sqlite3_blob_open(
  sqlite3* db,            /* The database connection */
  const char *zDb,        /* The attached database containing the blob */
  const char *zTable,     /* The table containing the blob */
  const char *zColumn,    /* The column containing the blob */
  sqlite_int64 iRow,      /* The row containing the glob */
  int wrFlag,             /* True -> read/write access, false -> read-only */
  sqlite3_blob **ppBlob   /* Handle for accessing the blob returned here */
){
  int nAttempt = 0;
  int iCol;               /* Index of zColumn in row-record */
  int rc = SQLITE_OK;
  char *zErr = 0;
  Table *pTab;
  Incrblob *pBlob = 0;
  Parse sParse;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppBlob==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  *ppBlob = 0;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTable==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  wrFlag = !!wrFlag;                /* wrFlag = (wrFlag ? 1 : 0); */

  sqlite3_mutex_enter(db->mutex);

  pBlob = (Incrblob *)sqlite3DbMallocZero(db, sizeof(Incrblob));
  do {
    memset(&sParse, 0, sizeof(Parse));
    if( !pBlob ) goto blob_open_out;
    sParse.db = db;
    sqlite3DbFree(db, zErr);
    zErr = 0;

    sqlite3BtreeEnterAll(db);
    pTab = sqlite3LocateTable(&sParse, 0, zTable, zDb);
    if( pTab && IsVirtual(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open virtual table: %s", zTable);
    }
    if( pTab && !HasRowid(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open table without rowid: %s", zTable);
    }
#ifndef SQLITE_OMIT_VIEW
    if( pTab && pTab->pSelect ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open view: %s", zTable);
    }
#endif
    if( !pTab ){
      if( sParse.zErrMsg ){
        sqlite3DbFree(db, zErr);
        zErr = sParse.zErrMsg;
        sParse.zErrMsg = 0;
      }
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }
    pBlob->pTab = pTab;
    pBlob->zDb = db->aDb[sqlite3SchemaToIndex(db, pTab->pSchema)].zDbSName;

    /* Now search pTab for the exact column. */
    for(iCol=0; iCol<pTab->nCol; iCol++) {
      if( sqlite3StrICmp(pTab->aCol[iCol].zName, zColumn)==0 ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      sqlite3DbFree(db, zErr);
      zErr = sqlite3MPrintf(db, "no such column: \"%s\"", zColumn);
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* If the value is being opened for writing, check that the
    ** column is not indexed, and that it is not part of a foreign key. 
    */
    if( wrFlag ){
      const char *zFault = 0;
      Index *pIdx;
#ifndef SQLITE_OMIT_FOREIGN_KEY
      if( db->flags&SQLITE_ForeignKeys ){
        /* Check that the column is not part of an FK child key definition. It
        ** is not necessary to check if it is part of a parent key, as parent
        ** key columns must be indexed. The check below will pick up this 
        ** case.  */
        FKey *pFKey;
        for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
          int j;
          for(j=0; j<pFKey->nCol; j++){
            if( pFKey->aCol[j].iFrom==iCol ){
              zFault = "foreign key";
            }
          }
        }
      }
#endif
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        int j;
        for(j=0; j<pIdx->nKeyCol; j++){
          /* FIXME: Be smarter about indexes that use expressions */
          if( pIdx->aiColumn[j]==iCol || pIdx->aiColumn[j]==XN_EXPR ){
            zFault = "indexed";
          }
        }
      }
      if( zFault ){
        sqlite3DbFree(db, zErr);
        zErr = sqlite3MPrintf(db, "cannot open %s column for writing", zFault);
        rc = SQLITE_ERROR;
        sqlite3BtreeLeaveAll(db);
        goto blob_open_out;
      }
    }

    pBlob->pStmt = (sqlite3_stmt *)sqlite3VdbeCreate(&sParse);
    assert( pBlob->pStmt || db->mallocFailed );
    if( pBlob->pStmt ){
      
      /* This VDBE program seeks a btree cursor to the identified 
      ** db/table/row entry. The reason for using a vdbe program instead
      ** of writing code to use the b-tree layer directly is that the
      ** vdbe program will take advantage of the various transaction,
      ** locking and error handling infrastructure built into the vdbe.
      **
      ** After seeking the cursor, the vdbe executes an OP_ResultRow.
      ** Code external to the Vdbe then "borrows" the b-tree cursor and
      ** uses it to implement the blob_read(), blob_write() and 
      ** blob_bytes() functions.
      **
      ** The sqlite3_blob_close() function finalizes the vdbe program,
      ** which closes the b-tree cursor and (possibly) commits the 
      ** transaction.
      */
      static const int iLn = VDBE_OFFSET_LINENO(2);
      static const VdbeOpList openBlob[] = {
        {OP_TableLock,      0, 0, 0},  /* 0: Acquire a read or write lock */
        {OP_OpenRead,       0, 0, 0},  /* 1: Open a cursor */
        /* blobSeekToRow() will initialize r[1] to the desired rowid */
        {OP_NotExists,      0, 5, 1},  /* 2: Seek the cursor to rowid=r[1] */
        {OP_Column,         0, 0, 1},  /* 3  */
        {OP_ResultRow,      1, 0, 0},  /* 4  */
        {OP_Halt,           0, 0, 0},  /* 5  */
      };
      Vdbe *v = (Vdbe *)pBlob->pStmt;
      int iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
      VdbeOp *aOp;

      sqlite3VdbeAddOp4Int(v, OP_Transaction, iDb, wrFlag, 
                           pTab->pSchema->schema_cookie,
                           pTab->pSchema->iGeneration);
      sqlite3VdbeChangeP5(v, 1);
      assert( sqlite3VdbeCurrentAddr(v)==2 || db->mallocFailed );
      aOp = sqlite3VdbeAddOpList(v, ArraySize(openBlob), openBlob, iLn);

      /* Make sure a mutex is held on the table to be accessed */
      sqlite3VdbeUsesBtree(v, iDb); 

      if( db->mallocFailed==0 ){
        assert( aOp!=0 );
        /* Configure the OP_TableLock instruction */
#ifdef SQLITE_OMIT_SHARED_CACHE
        aOp[0].opcode = OP_Noop;
#else
        aOp[0].p1 = iDb;
        aOp[0].p2 = pTab->tnum;
        aOp[0].p3 = wrFlag;
        sqlite3VdbeChangeP4(v, 2, pTab->zName, P4_TRANSIENT);
      }
      if( db->mallocFailed==0 ){
#endif

        /* Remove either the OP_OpenWrite or OpenRead. Set the P2 
        ** parameter of the other to pTab->tnum.  */
        if( wrFlag ) aOp[1].opcode = OP_OpenWrite;
        aOp[1].p2 = pTab->tnum;
        aOp[1].p3 = iDb;   

        /* Configure the number of columns. Configure the cursor to
        ** think that the table has one more column than it really
        ** does. An OP_Column to retrieve this imaginary column will
        ** always return an SQL NULL. This is useful because it means
        ** we can invoke OP_Column to fill in the vdbe cursors type 
        ** and offset cache without causing any IO.
        */
        aOp[1].p4type = P4_INT32;
        aOp[1].p4.i = pTab->nCol+1;
        aOp[3].p2 = pTab->nCol;

        sParse.nVar = 0;
        sParse.nMem = 1;
        sParse.nTab = 1;
        sqlite3VdbeMakeReady(v, &sParse);
      }
    }
   
    pBlob->iCol = iCol;
    pBlob->db = db;
    sqlite3BtreeLeaveAll(db);
    if( db->mallocFailed ){
      goto blob_open_out;
    }
    rc = blobSeekToRow(pBlob, iRow, &zErr);
  } while( (++nAttempt)<SQLITE_MAX_SCHEMA_RETRY && rc==SQLITE_SCHEMA );

blob_open_out:
  if( rc==SQLITE_OK && db->mallocFailed==0 ){
    *ppBlob = (sqlite3_blob *)pBlob;
  }else{
    if( pBlob && pBlob->pStmt ) sqlite3VdbeFinalize((Vdbe *)pBlob->pStmt);
    sqlite3DbFree(db, pBlob);
  }
  sqlite3ErrorWithMsg(db, rc, (zErr ? "%s" : 0), zErr);
  sqlite3DbFree(db, zErr);
  sqlite3ParserReset(&sParse);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}